

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

TValue * trace_exit_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  BCIns *pBVar1;
  
  *(undefined8 *)((long)L->cframe + 8) = 0xfff00240;
  pBVar1 = lj_snap_restore(*ud,*(void **)((long)ud + 8));
  *(BCIns **)((long)ud + 0x10) = pBVar1;
  return (TValue *)0x0;
}

Assistant:

static TValue *trace_exit_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  ExitDataCP *exd = (ExitDataCP *)ud;
  /* Always catch error here and don't call error function. */
  cframe_errfunc(L->cframe) = 0;
  cframe_nres(L->cframe) = -2*LUAI_MAXSTACK*(int)sizeof(TValue);
  exd->pc = lj_snap_restore(exd->J, exd->exptr);
  UNUSED(dummy);
  return NULL;
}